

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitBdd.c
# Opt level: O2

DdNode * Kit_GraphToBdd(DdManager *dd,Kit_Graph_t *pGraph)

{
  Kit_Node_t *pKVar1;
  uint uVar2;
  DdNode *pDVar3;
  long lVar4;
  uint uVar5;
  char *__assertion;
  long lVar6;
  undefined1 *puVar7;
  long lVar8;
  
  uVar2 = pGraph->nLeaves;
  if ((int)uVar2 < 0) {
    __assertion = "Kit_GraphLeaveNum(pGraph) >= 0";
    uVar2 = 0x67;
  }
  else {
    if ((int)uVar2 <= pGraph->nSize) {
      if (pGraph->fConst == 0) {
        uVar5 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
        if (uVar5 < uVar2) {
          pDVar3 = Cudd_bddIthVar(dd,uVar5);
        }
        else {
          lVar6 = 0;
          puVar7 = (undefined1 *)0x0;
          for (lVar8 = 0; lVar4 = (long)(int)uVar2, lVar8 < lVar4; lVar8 = lVar8 + 1) {
            pKVar1 = pGraph->pNodes;
            puVar7 = &(pKVar1->eEdge0).field_0x0 + lVar6;
            pDVar3 = Cudd_bddIthVar(dd,(int)lVar8);
            *(DdNode **)((long)&pKVar1->field_2 + lVar6) = pDVar3;
            uVar2 = pGraph->nLeaves;
            lVar6 = lVar6 + 0x18;
          }
          lVar6 = lVar4 * 0x18;
          for (; lVar4 < pGraph->nSize; lVar4 = lVar4 + 1) {
            pKVar1 = pGraph->pNodes;
            puVar7 = &(pKVar1->eEdge0).field_0x0 + lVar6;
            uVar2 = *(uint *)(&(pKVar1->eEdge0).field_0x0 + lVar6);
            uVar5 = *(uint *)(&(pKVar1->eEdge1).field_0x0 + lVar6);
            pDVar3 = Cudd_bddAnd(dd,(DdNode *)
                                    ((ulong)(uVar2 & 1) ^
                                    (ulong)pKVar1[uVar2 >> 1 & 0x3fffffff].field_2.pFunc),
                                 (DdNode *)
                                 ((ulong)(uVar5 & 1) ^
                                 (ulong)pKVar1[uVar5 >> 1 & 0x3fffffff].field_2.pFunc));
            *(DdNode **)((long)&pKVar1->field_2 + lVar6) = pDVar3;
            Cudd_Ref(pDVar3);
            lVar6 = lVar6 + 0x18;
          }
          pDVar3 = *(DdNode **)(puVar7 + 8);
          Cudd_Ref(pDVar3);
          lVar6 = (long)pGraph->nLeaves;
          lVar8 = lVar6 * 0x18 + 8;
          for (; lVar6 < pGraph->nSize; lVar6 = lVar6 + 1) {
            Cudd_RecursiveDeref(dd,*(DdNode **)(&(pGraph->pNodes->eEdge0).field_0x0 + lVar8));
            lVar8 = lVar8 + 0x18;
          }
          Cudd_Deref(pDVar3);
        }
      }
      else {
        pDVar3 = dd->one;
      }
      return (DdNode *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pDVar3);
    }
    __assertion = "Kit_GraphLeaveNum(pGraph) <= pGraph->nSize";
    uVar2 = 0x68;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitBdd.c"
                ,uVar2,"DdNode *Kit_GraphToBdd(DdManager *, Kit_Graph_t *)");
}

Assistant:

DdNode * Kit_GraphToBdd( DdManager * dd, Kit_Graph_t * pGraph )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    Kit_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;

    // sanity checks
    assert( Kit_GraphLeaveNum(pGraph) >= 0 );
    assert( Kit_GraphLeaveNum(pGraph) <= pGraph->nSize );

    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Cudd_NotCond( b1, Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Cudd_NotCond( Cudd_bddIthVar(dd, Kit_GraphVarInt(pGraph)), Kit_GraphIsComplement(pGraph) );

    // assign the elementary variables
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Cudd_bddIthVar( dd, i );

    // compute the function for each internal node
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        bFunc1 = Cudd_NotCond( Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( (DdNode *)pNode->pFunc );
    }

    // deref the intermediate results
    bFunc = (DdNode *)pNode->pFunc;   Cudd_Ref( bFunc );
    Kit_GraphForEachNode( pGraph, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pFunc );
    Cudd_Deref( bFunc );

    // complement the result if necessary
    return Cudd_NotCond( bFunc, Kit_GraphIsComplement(pGraph) );
}